

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManchesterAnalyzer.cpp
# Opt level: O3

void __thiscall ManchesterAnalyzer::~ManchesterAnalyzer(ManchesterAnalyzer *this)

{
  ~ManchesterAnalyzer(this);
  operator_delete(this);
  return;
}

Assistant:

ManchesterAnalyzer::~ManchesterAnalyzer()
{
    KillThread();
}